

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

RelationshipProperty * __thiscall
tinyusdz::RelationshipProperty::operator=(RelationshipProperty *this,RelationshipProperty *param_1)

{
  this->_authored = param_1->_authored;
  Relationship::operator=(&this->_relationship,&param_1->_relationship);
  return this;
}

Assistant:

RelationshipProperty() = default;